

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O1

int asn1_get_tagged_int(uchar **p,uchar *end,int tag,int *val)

{
  byte *pbVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  ulong local_20;
  
  pbVar1 = *p;
  if (end == pbVar1 || (long)end - (long)pbVar1 < 0) {
    iVar3 = -0x60;
  }
  else {
    iVar3 = -0x62;
    if ((uint)*pbVar1 == tag) {
      *p = pbVar1 + 1;
      iVar3 = mbedtls_asn1_get_len(p,end,&local_20);
    }
  }
  if (((iVar3 == 0) && (iVar3 = -100, local_20 != 0)) && (-1 < (char)**p)) {
    if (local_20 != 0) {
      puVar2 = *p;
      do {
        if (*puVar2 != '\0') goto LAB_0021eeb1;
        *p = puVar2 + 1;
        local_20 = local_20 - 1;
        puVar2 = puVar2 + 1;
      } while (local_20 != 0);
      local_20 = 0;
    }
LAB_0021eeb1:
    if ((local_20 < 5) && ((local_20 != 4 || (-1 < (char)**p)))) {
      *val = 0;
      if (local_20 != 0) {
        uVar4 = *val;
        pbVar1 = *p;
        do {
          uVar4 = uVar4 << 8 | (uint)*pbVar1;
          *val = uVar4;
          *p = pbVar1 + 1;
          local_20 = local_20 - 1;
          pbVar1 = pbVar1 + 1;
        } while (local_20 != 0);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int asn1_get_tagged_int(unsigned char **p,
                               const unsigned char *end,
                               int tag, int *val)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, tag)) != 0) {
        return ret;
    }

    /*
     * len==0 is malformed (0 must be represented as 020100 for INTEGER,
     * or 0A0100 for ENUMERATED tags
     */
    if (len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    /* This is a cryptography library. Reject negative integers. */
    if ((**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    /* Skip leading zeros. */
    while (len > 0 && **p == 0) {
        ++(*p);
        --len;
    }

    /* Reject integers that don't fit in an int. This code assumes that
     * the int type has no padding bit. */
    if (len > sizeof(int)) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    if (len == sizeof(int) && (**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    *val = 0;
    while (len-- > 0) {
        *val = (*val << 8) | **p;
        (*p)++;
    }

    return 0;
}